

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

internal * __thiscall testing::internal::FormatDeathTestOutput(internal *this,string *output)

{
  string local_80 [32];
  string local_60 [48];
  long local_30;
  size_t line_end;
  size_t at;
  string *local_18;
  string *output_local;
  string *ret;
  
  at._7_1_ = 0;
  local_18 = output;
  output_local = (string *)this;
  std::__cxx11::string::string((string *)this);
  line_end = 0;
  while( true ) {
    local_30 = std::__cxx11::string::find((char)local_18,10);
    std::__cxx11::string::operator+=((string *)this,"[  DEATH   ] ");
    if (local_30 == -1) break;
    std::__cxx11::string::substr((ulong)local_80,(ulong)local_18);
    std::__cxx11::string::operator+=((string *)this,local_80);
    std::__cxx11::string::~string(local_80);
    line_end = local_30 + 1;
  }
  std::__cxx11::string::substr((ulong)local_60,(ulong)local_18);
  std::__cxx11::string::operator+=((string *)this,local_60);
  std::__cxx11::string::~string(local_60);
  return this;
}

Assistant:

static ::std::string FormatDeathTestOutput(const ::std::string& output) {
  ::std::string ret;
  for (size_t at = 0; ; ) {
    const size_t line_end = output.find('\n', at);
    ret += "[  DEATH   ] ";
    if (line_end == ::std::string::npos) {
      ret += output.substr(at);
      break;
    }
    ret += output.substr(at, line_end + 1 - at);
    at = line_end + 1;
  }
  return ret;
}